

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySSA.cpp
# Opt level: O0

void __thiscall
dg::dda::MemorySSATransformation::collectAllDefinitions
          (MemorySSATransformation *this,RWNode *from,Definitions *defs,bool escaping)

{
  bool bVar1;
  RWBBlock *this_00;
  byte in_CL;
  Definitions *in_RDX;
  RWNode *in_RSI;
  Definitions tmpDefs;
  iterator E;
  iterator I;
  RWBBlock *singlePred;
  Definitions D;
  set<dg::dda::RWBBlock_*,_std::less<dg::dda::RWBBlock_*>,_std::allocator<dg::dda::RWBBlock_*>_>
  visitedBlocks;
  RWBBlock *block;
  Definitions *in_stack_fffffffffffffd08;
  Definitions *in_stack_fffffffffffffd10;
  iterator in_stack_fffffffffffffd30;
  undefined1 escaping_00;
  iterator in_stack_fffffffffffffd38;
  iterator in_stack_fffffffffffffd40;
  RWNode *in_stack_fffffffffffffd48;
  vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *in_stack_fffffffffffffd50;
  __normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
  in_stack_fffffffffffffd58;
  __normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
  in_stack_fffffffffffffd60;
  const_iterator in_stack_fffffffffffffd68;
  __normal_iterator<dg::dda::RWBBlock_**,_std::vector<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>_>
  local_218;
  RWBBlock *local_210;
  undefined1 in_stack_fffffffffffffe47;
  set<dg::dda::RWBBlock_*,_std::less<dg::dda::RWBBlock_*>,_std::allocator<dg::dda::RWBBlock_*>_>
  *in_stack_fffffffffffffe48;
  RWBBlock *in_stack_fffffffffffffe50;
  Definitions *in_stack_fffffffffffffe58;
  MemorySSATransformation *in_stack_fffffffffffffe60;
  
  this_00 = RWNode::getBBlock(in_RSI);
  std::
  set<dg::dda::RWBBlock_*,_std::less<dg::dda::RWBBlock_*>,_std::allocator<dg::dda::RWBBlock_*>_>::
  set((set<dg::dda::RWBBlock_*,_std::less<dg::dda::RWBBlock_*>,_std::allocator<dg::dda::RWBBlock_*>_>
       *)0x175349);
  Definitions::Definitions(in_stack_fffffffffffffd10);
  if ((in_CL & 1) == 0) {
    findDefinitionsInBlock
              ((RWNode *)in_stack_fffffffffffffd68._M_current,
               (RWNode *)in_stack_fffffffffffffd60._M_current);
    Definitions::operator=(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
    Definitions::~Definitions(in_stack_fffffffffffffd10);
  }
  else {
    findEscapingDefinitionsInBlock(in_stack_fffffffffffffd48);
    Definitions::operator=(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
    Definitions::~Definitions(in_stack_fffffffffffffd10);
  }
  local_210 = ElemWithEdges<dg::dda::RWBBlock>::getSinglePredecessor
                        ((ElemWithEdges<dg::dda::RWBBlock> *)in_stack_fffffffffffffd10);
  escaping_00 = (undefined1)((ulong)in_stack_fffffffffffffd30._M_current >> 0x38);
  if (local_210 == (RWBBlock *)0x0) {
    local_218._M_current =
         (RWBBlock **)
         ElemWithEdges<dg::dda::RWBBlock>::pred_begin
                   ((ElemWithEdges<dg::dda::RWBBlock> *)in_stack_fffffffffffffd08);
    ElemWithEdges<dg::dda::RWBBlock>::pred_end
              ((ElemWithEdges<dg::dda::RWBBlock> *)in_stack_fffffffffffffd08);
    while( true ) {
      escaping_00 = (undefined1)((ulong)in_stack_fffffffffffffd30._M_current >> 0x38);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<dg::dda::RWBBlock_**,_std::vector<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>_>
                          *)in_stack_fffffffffffffd10,
                         (__normal_iterator<dg::dda::RWBBlock_**,_std::vector<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>_>
                          *)in_stack_fffffffffffffd08);
      if (!bVar1) break;
      Definitions::Definitions(in_stack_fffffffffffffd10);
      DefinitionsMap<dg::dda::RWNode>::operator=
                ((DefinitionsMap<dg::dda::RWNode> *)in_stack_fffffffffffffd10,
                 (DefinitionsMap<dg::dda::RWNode> *)in_stack_fffffffffffffd08);
      __gnu_cxx::
      __normal_iterator<dg::dda::RWBBlock_**,_std::vector<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>_>
      ::operator*(&local_218);
      collectAllDefinitions
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                 in_stack_fffffffffffffe48,(bool)in_stack_fffffffffffffe47);
      DefinitionsMap<dg::dda::RWNode>::add
                ((DefinitionsMap<dg::dda::RWNode> *)in_stack_fffffffffffffd40._M_current,
                 (DefinitionsMap<dg::dda::RWNode> *)in_stack_fffffffffffffd38._M_current);
      in_stack_fffffffffffffd40 =
           std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::end
                     ((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)
                      in_stack_fffffffffffffd08);
      __gnu_cxx::
      __normal_iterator<dg::dda::RWNode*const*,std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>>
      ::__normal_iterator<dg::dda::RWNode**>
                ((__normal_iterator<dg::dda::RWNode_*const_*,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
                  *)in_stack_fffffffffffffd10,
                 (__normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
                  *)in_stack_fffffffffffffd08);
      in_stack_fffffffffffffd38 =
           std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::begin
                     ((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)
                      in_stack_fffffffffffffd08);
      in_stack_fffffffffffffd30 =
           std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::end
                     ((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)
                      in_stack_fffffffffffffd08);
      std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>::
      insert<__gnu_cxx::__normal_iterator<dg::dda::RWNode**,std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>>,void>
                (in_stack_fffffffffffffd50,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
                 in_stack_fffffffffffffd58);
      Definitions::~Definitions(in_stack_fffffffffffffd10);
      __gnu_cxx::
      __normal_iterator<dg::dda::RWBBlock_**,_std::vector<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>_>
      ::operator++(&local_218);
    }
  }
  else {
    collectAllDefinitions
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
               in_stack_fffffffffffffe48,(bool)in_stack_fffffffffffffe47);
  }
  RWBBlock::getSubgraph(this_00);
  collectAllDefinitionsInCallers
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
             (RWSubgraph *)in_stack_fffffffffffffe50);
  joinDefinitions((Definitions *)in_stack_fffffffffffffd40._M_current,
                  (Definitions *)in_stack_fffffffffffffd38._M_current,(bool)escaping_00);
  Definitions::swap(in_RDX,in_stack_fffffffffffffd08);
  Definitions::~Definitions(in_RDX);
  std::
  set<dg::dda::RWBBlock_*,_std::less<dg::dda::RWBBlock_*>,_std::allocator<dg::dda::RWBBlock_*>_>::
  ~set((set<dg::dda::RWBBlock_*,_std::less<dg::dda::RWBBlock_*>,_std::allocator<dg::dda::RWBBlock_*>_>
        *)0x1755f8);
  return;
}

Assistant:

void MemorySSATransformation::collectAllDefinitions(RWNode *from,
                                                    Definitions &defs,
                                                    bool escaping) {
    assert(from->getBBlock() && "The node has no BBlock");

    auto *block = from->getBBlock();
    std::set<RWBBlock *> visitedBlocks; // for terminating the search

    Definitions D;
    if (escaping) {
        D = findEscapingDefinitionsInBlock(from);
    } else {
        D = findDefinitionsInBlock(from);
    }

    ///
    // -- Get the definitions from predecessors in this subgraph --
    //
    // NOTE: do not add block to visitedBlocks, it may be its own predecessor,
    // in which case we want to process it again
    if (auto *singlePred = block->getSinglePredecessor()) {
        collectAllDefinitions(defs, singlePred, visitedBlocks, escaping);
    } else {
        // multiple predecessors
        for (auto I = block->pred_begin(), E = block->pred_end(); I != E; ++I) {
            // assign 'kills' to not to search for what we already have
            Definitions tmpDefs;
            tmpDefs.definitions = D.kills;
            collectAllDefinitions(tmpDefs, *I, visitedBlocks, escaping);
            defs.definitions.add(tmpDefs.definitions);
            defs.unknownWrites.insert(defs.unknownWrites.end(),
                                      tmpDefs.unknownWrites.begin(),
                                      tmpDefs.unknownWrites.end());
        }
    }

    ///
    // -- Get the definitions from predecessors
    //    in the callers of this subgraph --
    //
    collectAllDefinitionsInCallers(defs, block->getSubgraph());

    // create the final map of definitions reaching the 'from' node
    joinDefinitions(defs, D);
    defs.swap(D);
}